

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

char * mg_strcasestr(char *big_str,char *small_str)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  ulong uVar3;
  
  sVar2 = strlen(big_str);
  len = strlen(small_str);
  if (len <= sVar2) {
    uVar3 = 0;
    do {
      iVar1 = mg_strncasecmp(big_str + uVar3,small_str,len);
      if (iVar1 == 0) {
        return big_str + uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= sVar2 - len);
  }
  return (char *)0x0;
}

Assistant:

static const char *
mg_strcasestr(const char *big_str, const char *small_str)
{
	size_t i, big_len = strlen(big_str), small_len = strlen(small_str);

	if (big_len >= small_len) {
		for (i = 0; i <= (big_len - small_len); i++) {
			if (mg_strncasecmp(big_str + i, small_str, small_len) == 0) {
				return big_str + i;
			}
		}
	}

	return NULL;
}